

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::StandardNumericToDecimalCast<short,int,duckdb::SignedToDecimalOperator>
               (short input,int *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  bool bVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000081;
  uchar in_R9B;
  uint uVar5;
  string error;
  allocator local_69;
  Exception local_68 [2];
  string local_48;
  
  uVar2 = CONCAT71(in_register_00000081,scale) & 0xffffffff;
  uVar5 = (uint)input;
  iVar3 = (int)*(undefined8 *)
                (NumericHelper::POWERS_OF_TEN +
                ((CONCAT71(in_register_00000009,width) & 0xffffffff) - uVar2) * 8);
  uVar4 = -iVar3;
  bVar1 = SBORROW4(uVar5,uVar4) == (int)(uVar5 + iVar3) < 0;
  if ((uVar5 != uVar4 && bVar1) && (int)uVar5 < iVar3) {
    *result = uVar5 * *(int *)(NumericHelper::POWERS_OF_TEN + uVar2 * 8);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_68,"Could not cast value %d to DECIMAL(%d,%d)",&local_69);
    Exception::ConstructMessage<short,unsigned_char,unsigned_char>
              (&local_48,local_68,(string *)(ulong)uVar5,(ushort)width,scale,in_R9B);
    ::std::__cxx11::string::~string((string *)local_68);
    HandleCastError::AssignError(&local_48,parameters);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return (uVar5 != uVar4 && bVar1) && (int)uVar5 < iVar3;
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}